

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t_conflict *context)

{
  player_state_conflict state;
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  level_conflict *plVar6;
  monster *mon;
  loc_conflict lVar7;
  char *fmt;
  long lVar8;
  player_state_conflict *ppVar9;
  undefined8 *puVar10;
  byte bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined1 in_stack_fffffffffffffe68 [312];
  char *msg;
  loc_conflict decoy;
  monster *t_mon;
  wchar_t target_place;
  level *current;
  _Bool down;
  _Bool up;
  effect_handler_context_t_conflict *context_local;
  
  bVar11 = 0;
  bVar2 = true;
  plVar6 = world->levels + player->place;
  player_get_next_place(plVar6->index,"down",L'\x01');
  mon = monster_target_monster(context);
  lVar7 = (loc_conflict)cave_find_decoy(cave);
  context->ident = true;
  if ((player->upkeep->arena_level & 1U) == 0) {
    if (mon == (monster *)0x0) {
      msg._4_4_ = lVar7.y;
      if ((msg._4_4_ == L'\0') || (msg._0_4_ = lVar7.x, (wchar_t)msg == L'\0')) {
        lVar7.x = (player->grid).x;
        lVar7.y = (player->grid).y;
        _Var3 = square_isno_teleport((chunk *)cave,lVar7);
        if (_Var3) {
          ::msg("Teleportation forbidden!");
        }
        else {
          _Var3 = player_of_has(player,L'\x1d');
          if (_Var3) {
            equip_learn_flag(player,L'\x1d');
            ::msg("Teleportation forbidden!");
          }
          else {
            if ((context->origin).what == SRC_MONSTER) {
              ppVar9 = &player->state;
              puVar10 = (undefined8 *)&stack0xfffffffffffffe68;
              for (lVar8 = 0x27; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar10 = *(undefined8 *)ppVar9->stat_add;
                ppVar9 = (player_state_conflict *)((long)ppVar9 + (ulong)bVar11 * -0x10 + 8);
                puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
              }
              state._312_4_ = *(undefined4 *)&(player->state).el_info[0x1b].flags;
              uVar12 = in_stack_fffffffffffffe68._202_4_;
              uVar13 = in_stack_fffffffffffffe68._206_4_;
              uVar14 = in_stack_fffffffffffffe68._210_4_;
              uVar15 = in_stack_fffffffffffffe68._214_4_;
              uVar16 = in_stack_fffffffffffffe68._218_4_;
              uVar17 = in_stack_fffffffffffffe68._222_4_;
              uVar18 = in_stack_fffffffffffffe68._226_4_;
              uVar19 = in_stack_fffffffffffffe68._230_4_;
              uVar20 = in_stack_fffffffffffffe68._234_4_;
              uVar21 = in_stack_fffffffffffffe68._238_4_;
              uVar22 = in_stack_fffffffffffffe68._242_4_;
              uVar23 = in_stack_fffffffffffffe68._246_4_;
              uVar24 = in_stack_fffffffffffffe68._250_4_;
              uVar25 = in_stack_fffffffffffffe68._254_4_;
              uVar26 = in_stack_fffffffffffffe68._258_4_;
              uVar27 = in_stack_fffffffffffffe68._262_4_;
              uVar28 = in_stack_fffffffffffffe68._266_4_;
              uVar29 = in_stack_fffffffffffffe68._270_4_;
              uVar30 = in_stack_fffffffffffffe68._274_4_;
              uVar31 = in_stack_fffffffffffffe68._278_4_;
              uVar32 = in_stack_fffffffffffffe68._282_4_;
              uVar33 = in_stack_fffffffffffffe68._286_4_;
              uVar34 = in_stack_fffffffffffffe68._290_4_;
              uVar35 = in_stack_fffffffffffffe68._294_4_;
              uVar36 = in_stack_fffffffffffffe68._298_4_;
              uVar37 = in_stack_fffffffffffffe68._302_4_;
              uVar38 = in_stack_fffffffffffffe68._306_4_;
              state.stat_add[0] = in_stack_fffffffffffffe68._0_4_;
              state.stat_add[1] = in_stack_fffffffffffffe68._4_4_;
              state.stat_add[2] = in_stack_fffffffffffffe68._8_4_;
              state.stat_add[3] = in_stack_fffffffffffffe68._12_4_;
              state.stat_add[4] = in_stack_fffffffffffffe68._16_4_;
              state.stat_ind[0] = in_stack_fffffffffffffe68._20_4_;
              state.stat_ind[1] = in_stack_fffffffffffffe68._24_4_;
              state.stat_ind[2] = in_stack_fffffffffffffe68._28_4_;
              state.stat_ind[3] = in_stack_fffffffffffffe68._32_4_;
              state.stat_ind[4] = in_stack_fffffffffffffe68._36_4_;
              state.stat_use[0] = in_stack_fffffffffffffe68._40_4_;
              state.stat_use[1] = in_stack_fffffffffffffe68._44_4_;
              state.stat_use[2] = in_stack_fffffffffffffe68._48_4_;
              state.stat_use[3] = in_stack_fffffffffffffe68._52_4_;
              state.stat_use[4] = in_stack_fffffffffffffe68._56_4_;
              state.stat_top[0] = in_stack_fffffffffffffe68._60_4_;
              state.stat_top[1] = in_stack_fffffffffffffe68._64_4_;
              state.stat_top[2] = in_stack_fffffffffffffe68._68_4_;
              state.stat_top[3] = in_stack_fffffffffffffe68._72_4_;
              state.stat_top[4] = in_stack_fffffffffffffe68._76_4_;
              state.skills[0] = in_stack_fffffffffffffe68._80_4_;
              state.skills[1] = in_stack_fffffffffffffe68._84_4_;
              state.skills[2] = in_stack_fffffffffffffe68._88_4_;
              state.skills[3] = in_stack_fffffffffffffe68._92_4_;
              state.skills[4] = in_stack_fffffffffffffe68._96_4_;
              state.skills[5] = in_stack_fffffffffffffe68._100_4_;
              state.skills[6] = in_stack_fffffffffffffe68._104_4_;
              state.skills[7] = in_stack_fffffffffffffe68._108_4_;
              state.skills[8] = in_stack_fffffffffffffe68._112_4_;
              state.skills[9] = in_stack_fffffffffffffe68._116_4_;
              state.speed = in_stack_fffffffffffffe68._120_4_;
              state.num_blows = in_stack_fffffffffffffe68._124_4_;
              state.num_shots = in_stack_fffffffffffffe68._128_4_;
              state.num_moves = in_stack_fffffffffffffe68._132_4_;
              state.ammo_mult = in_stack_fffffffffffffe68._136_4_;
              state.ammo_tval = in_stack_fffffffffffffe68._140_4_;
              state.ac = in_stack_fffffffffffffe68._144_4_;
              state.dam_red = in_stack_fffffffffffffe68._148_4_;
              state.perc_dam_red = in_stack_fffffffffffffe68._152_4_;
              state.to_a = in_stack_fffffffffffffe68._156_4_;
              state.to_h = in_stack_fffffffffffffe68._160_4_;
              state.to_d = in_stack_fffffffffffffe68._164_4_;
              state.see_infra = in_stack_fffffffffffffe68._168_4_;
              state.cur_light = in_stack_fffffffffffffe68._172_4_;
              state.evasion_chance = in_stack_fffffffffffffe68._176_4_;
              state.shield_on_back = (_Bool)in_stack_fffffffffffffe68[0xb4];
              state.heavy_wield = (_Bool)in_stack_fffffffffffffe68[0xb5];
              state.heavy_shoot = (_Bool)in_stack_fffffffffffffe68[0xb6];
              state.bless_wield = (_Bool)in_stack_fffffffffffffe68[0xb7];
              state.cumber_armor = (_Bool)in_stack_fffffffffffffe68[0xb8];
              state.flags[0] = in_stack_fffffffffffffe68[0xb9];
              state.flags[1] = in_stack_fffffffffffffe68[0xba];
              state.flags[2] = in_stack_fffffffffffffe68[0xbb];
              state.flags[3] = in_stack_fffffffffffffe68[0xbc];
              state.flags[4] = in_stack_fffffffffffffe68[0xbd];
              state.flags[5] = in_stack_fffffffffffffe68[0xbe];
              state.pflags[0] = in_stack_fffffffffffffe68[0xbf];
              state.pflags[1] = in_stack_fffffffffffffe68[0xc0];
              state.pflags[2] = in_stack_fffffffffffffe68[0xc1];
              state.pflags[3] = in_stack_fffffffffffffe68[0xc2];
              state.pflags[4] = in_stack_fffffffffffffe68[0xc3];
              state.pflags[5] = in_stack_fffffffffffffe68[0xc4];
              state.pflags[6] = in_stack_fffffffffffffe68[0xc5];
              state.pflags[7] = in_stack_fffffffffffffe68[0xc6];
              state.pflags[8] = in_stack_fffffffffffffe68[199];
              state.pflags[9] = in_stack_fffffffffffffe68[200];
              state._201_1_ = in_stack_fffffffffffffe68[0xc9];
              state.el_info[0].res_level = (short)uVar12;
              state.el_info[0].flags = (char)((uint)uVar12 >> 0x10);
              state.el_info[0]._3_1_ = (char)((uint)uVar12 >> 0x18);
              state.el_info[1].res_level = (short)uVar13;
              state.el_info[1].flags = (char)((uint)uVar13 >> 0x10);
              state.el_info[1]._3_1_ = (char)((uint)uVar13 >> 0x18);
              state.el_info[2].res_level = (short)uVar14;
              state.el_info[2].flags = (char)((uint)uVar14 >> 0x10);
              state.el_info[2]._3_1_ = (char)((uint)uVar14 >> 0x18);
              state.el_info[3].res_level = (short)uVar15;
              state.el_info[3].flags = (char)((uint)uVar15 >> 0x10);
              state.el_info[3]._3_1_ = (char)((uint)uVar15 >> 0x18);
              state.el_info[4].res_level = (short)uVar16;
              state.el_info[4].flags = (char)((uint)uVar16 >> 0x10);
              state.el_info[4]._3_1_ = (char)((uint)uVar16 >> 0x18);
              state.el_info[5].res_level = (short)uVar17;
              state.el_info[5].flags = (char)((uint)uVar17 >> 0x10);
              state.el_info[5]._3_1_ = (char)((uint)uVar17 >> 0x18);
              state.el_info[6].res_level = (short)uVar18;
              state.el_info[6].flags = (char)((uint)uVar18 >> 0x10);
              state.el_info[6]._3_1_ = (char)((uint)uVar18 >> 0x18);
              state.el_info[7].res_level = (short)uVar19;
              state.el_info[7].flags = (char)((uint)uVar19 >> 0x10);
              state.el_info[7]._3_1_ = (char)((uint)uVar19 >> 0x18);
              state.el_info[8].res_level = (short)uVar20;
              state.el_info[8].flags = (char)((uint)uVar20 >> 0x10);
              state.el_info[8]._3_1_ = (char)((uint)uVar20 >> 0x18);
              state.el_info[9].res_level = (short)uVar21;
              state.el_info[9].flags = (char)((uint)uVar21 >> 0x10);
              state.el_info[9]._3_1_ = (char)((uint)uVar21 >> 0x18);
              state.el_info[10].res_level = (short)uVar22;
              state.el_info[10].flags = (char)((uint)uVar22 >> 0x10);
              state.el_info[10]._3_1_ = (char)((uint)uVar22 >> 0x18);
              state.el_info[0xb].res_level = (short)uVar23;
              state.el_info[0xb].flags = (char)((uint)uVar23 >> 0x10);
              state.el_info[0xb]._3_1_ = (char)((uint)uVar23 >> 0x18);
              state.el_info[0xc].res_level = (short)uVar24;
              state.el_info[0xc].flags = (char)((uint)uVar24 >> 0x10);
              state.el_info[0xc]._3_1_ = (char)((uint)uVar24 >> 0x18);
              state.el_info[0xd].res_level = (short)uVar25;
              state.el_info[0xd].flags = (char)((uint)uVar25 >> 0x10);
              state.el_info[0xd]._3_1_ = (char)((uint)uVar25 >> 0x18);
              state.el_info[0xe].res_level = (short)uVar26;
              state.el_info[0xe].flags = (char)((uint)uVar26 >> 0x10);
              state.el_info[0xe]._3_1_ = (char)((uint)uVar26 >> 0x18);
              state.el_info[0xf].res_level = (short)uVar27;
              state.el_info[0xf].flags = (char)((uint)uVar27 >> 0x10);
              state.el_info[0xf]._3_1_ = (char)((uint)uVar27 >> 0x18);
              state.el_info[0x10].res_level = (short)uVar28;
              state.el_info[0x10].flags = (char)((uint)uVar28 >> 0x10);
              state.el_info[0x10]._3_1_ = (char)((uint)uVar28 >> 0x18);
              state.el_info[0x11].res_level = (short)uVar29;
              state.el_info[0x11].flags = (char)((uint)uVar29 >> 0x10);
              state.el_info[0x11]._3_1_ = (char)((uint)uVar29 >> 0x18);
              state.el_info[0x12].res_level = (short)uVar30;
              state.el_info[0x12].flags = (char)((uint)uVar30 >> 0x10);
              state.el_info[0x12]._3_1_ = (char)((uint)uVar30 >> 0x18);
              state.el_info[0x13].res_level = (short)uVar31;
              state.el_info[0x13].flags = (char)((uint)uVar31 >> 0x10);
              state.el_info[0x13]._3_1_ = (char)((uint)uVar31 >> 0x18);
              state.el_info[0x14].res_level = (short)uVar32;
              state.el_info[0x14].flags = (char)((uint)uVar32 >> 0x10);
              state.el_info[0x14]._3_1_ = (char)((uint)uVar32 >> 0x18);
              state.el_info[0x15].res_level = (short)uVar33;
              state.el_info[0x15].flags = (char)((uint)uVar33 >> 0x10);
              state.el_info[0x15]._3_1_ = (char)((uint)uVar33 >> 0x18);
              state.el_info[0x16].res_level = (short)uVar34;
              state.el_info[0x16].flags = (char)((uint)uVar34 >> 0x10);
              state.el_info[0x16]._3_1_ = (char)((uint)uVar34 >> 0x18);
              state.el_info[0x17].res_level = (short)uVar35;
              state.el_info[0x17].flags = (char)((uint)uVar35 >> 0x10);
              state.el_info[0x17]._3_1_ = (char)((uint)uVar35 >> 0x18);
              state.el_info[0x18].res_level = (short)uVar36;
              state.el_info[0x18].flags = (char)((uint)uVar36 >> 0x10);
              state.el_info[0x18]._3_1_ = (char)((uint)uVar36 >> 0x18);
              state.el_info[0x19].res_level = (short)uVar37;
              state.el_info[0x19].flags = (char)((uint)uVar37 >> 0x10);
              state.el_info[0x19]._3_1_ = (char)((uint)uVar37 >> 0x18);
              state.el_info[0x1a].res_level = (short)uVar38;
              state.el_info[0x1a].flags = (char)((uint)uVar38 >> 0x10);
              state.el_info[0x1a]._3_1_ = (char)((uint)uVar38 >> 0x18);
              state.el_info[0x1b].res_level = in_stack_fffffffffffffe68._310_2_;
              _Var3 = player_resists_effects(state,L'\t');
              if (_Var3) {
                ::msg("You resist the effect!");
                return true;
              }
              _Var3 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags",
                                   "(PF_PHASEWALK)");
              if (_Var3) {
                ::msg("Teleport resistance!");
                return true;
              }
            }
            _Var3 = quest_forbid_downstairs((int)player->place);
            bVar1 = !_Var3;
            if ((plVar6->up == (char *)0x0) &&
               (_Var3 = mountain_top_possible(plVar6->index), !_Var3)) {
              bVar2 = false;
            }
            if ((plVar6->down == (char *)0x0) &&
               (_Var3 = underworld_possible(plVar6->index), !_Var3)) {
              bVar1 = false;
            }
            if ((bVar2) && (bVar1)) {
              uVar4 = Rand_div(100);
              if ((int)uVar4 < 0x32) {
                bVar2 = false;
              }
              else {
                bVar1 = false;
              }
            }
            if (bVar2) {
              fmt = "You rise into the air.";
              if (plVar6->topography == TOP_CAVE) {
                fmt = "You rise up through the ceiling.";
              }
              msgt(0x19,fmt);
              cmdq_flush();
              wVar5 = player_get_next_place((int)player->place,"up",L'\x01');
              player_change_place(player,wVar5);
            }
            else if (bVar1) {
              msgt(0x19,"You sink through the floor.");
              cmdq_flush();
              wVar5 = player_get_next_place((int)player->place,"down",L'\x01');
              player_change_place(player,wVar5);
            }
            else {
              ::msg("Nothing happens.");
            }
          }
        }
      }
      else {
        square_destroy_decoy((chunk *)cave,lVar7);
      }
    }
    else {
      add_monster_message(mon,L'\x17',false);
      delete_monster_idx((chunk *)cave,mon->midx);
    }
  }
  return true;
}

Assistant:

bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t *context)
{
	bool up = true;
	bool down = true;
	struct level *current = &world->levels[player->place];
	int target_place = player_get_next_place(current->index, "down", 1);
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Check for monster targeting another monster */
	if (t_mon) {
		/* Monster is just gone */
		add_monster_message(t_mon, MON_MSG_DISAPPEAR, false);
		delete_monster_idx(cave, t_mon->midx);
		return true;
	}

	/* Targeted decoys get destroyed */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* Check for a no teleport grid */
	if (square_isno_teleport(cave, player->grid)) {
		msg("Teleportation forbidden!");
		return true;
	}

	/* Check for a no teleport curse */
	if (player_of_has(player, OF_NO_TELEPORT)) {
		equip_learn_flag(player, OF_NO_TELEPORT);
		msg("Teleportation forbidden!");
		return true;
	}

	/* Resist hostile teleport */
	if (context->origin.what == SRC_MONSTER) {
		if (player_resists_effects(player->state, ELEM_NEXUS)) {
			msg("You resist the effect!");
			return true;
		} else if (player_has(player, PF_PHASEWALK)) {
			msg("Teleport resistance!");
			return true;
		}
	}

	/* No going up with force_descend or in the town */
	//if (OPT(player, birth_force_descend) || !player->depth)
	//	up = false;

	/* No forcing player down to quest levels if they can't leave */
	if (!up && quest_forbid_downstairs(target_place))
		down = false;

	/* Can't leave quest levels or go down deeper than the dungeon */
	if (quest_forbid_downstairs(player->place))
		down = false;

	/* Deal with underworld and mountain top */
	if (!current->up && !mountain_top_possible(current->index)) {
		up = false;
	}
	if (!current->down && !underworld_possible(current->index)) {
 		down = false;
	}
 
 	/* Determine up/down if not already done */
 	if (up && down) {
		if (randint0(100) < 50) {
 			up = false;
		} else {
 			down = false;
		}
 	}

	/*
	 * Now actually do the level change; flush the command queue to
	 * prevent the character from losing an action when first entering
	 * the new level (for instance, player moves putting an autopickup
	 * command in the queue and is then hit by a teleport level spell)
	 */
	if (up) {
		const char *msg = (current->topography == TOP_CAVE) ?
			"You rise up through the ceiling." : "You rise into the air.";
		msgt(MSG_TPLEVEL, msg);
		cmdq_flush();
		target_place = player_get_next_place(player->place, "up", 1);
		player_change_place(player, target_place);
 	} else if (down) {
 		msgt(MSG_TPLEVEL, "You sink through the floor.");
		cmdq_flush();
 
		//if (OPT(player, birth_force_descend)) {
		//	target_place = player_get_next_place(player->max_depth, "down", 1);
		//	player_change_place(player, target_place);
		//} else {
		target_place = player_get_next_place(player->place, "down", 1);
		player_change_place(player, target_place);
		//}
	} else {
		msg("Nothing happens.");
	}

	return true;
}